

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_writer.c
# Opt level: O2

dtl_error_t dtl_json_writer_write_dv(dtl_json_writer_t *self,dtl_dv_t *dv,_Bool indentEnable)

{
  char *pcVar1;
  _Bool _Var2;
  adt_error_t aVar3;
  dtl_dv_type_id dVar4;
  dtl_sv_type_id dVar5;
  int32_t iVar6;
  uint uVar7;
  dtl_error_t extraout_EAX;
  undefined8 in_RAX;
  dtl_av_t *pdVar8;
  dtl_dv_t *pdVar9;
  dtl_sv_t *pdVar10;
  char *pcVar11;
  dtl_av_t *cstr;
  dtl_av_t *extraout_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int iVar12;
  FILE *__stream;
  adt_str_t *self_00;
  _Bool local_7d;
  int local_7c;
  char buf [64];
  
  cstr = (dtl_av_t *)CONCAT71((int7)((ulong)in_RAX >> 8),self == (dtl_json_writer_t *)0x0);
  if (dv == (dtl_dv_t *)0x0 || self == (dtl_json_writer_t *)0x0) goto switchD_0013a1b7_caseD_2;
  dVar4 = dtl_dv_type(dv);
  if (dVar4 == DTL_DV_HASH) {
    pdVar8 = dtl_hv_keys((dtl_hv_t *)dv);
    cstr = pdVar8;
    if (pdVar8 != (dtl_av_t *)0x0) {
      if (self->sortKeys == true) {
        uVar7 = dtl_av_sort(pdVar8,(dtl_key_func_t *)0x0,false);
        cstr = (dtl_av_t *)(ulong)uVar7;
        if (uVar7 != 0) goto switchD_0013a1b7_caseD_2;
      }
      iVar6 = dtl_av_length(pdVar8);
      if (indentEnable) {
        dtl_json_writer_indented_cstr(self,"{");
      }
      else {
        dtl_json_writer_putc(self,'{');
      }
      if (0 < iVar6) {
        dtl_json_writer_increaseIndent(self);
        if (self->currentIndent == 0) {
          for (iVar12 = 0; iVar6 != iVar12; iVar12 = iVar12 + 1) {
            buf[0] = '\0';
            pdVar10 = (dtl_sv_t *)dtl_av_value(pdVar8,iVar12);
            pcVar11 = dtl_sv_to_cstr(pdVar10,(_Bool *)buf);
            if (buf[0] == '\x01') {
              if (iVar12 != 0) {
                dtl_json_writer_print(self,", ");
              }
              dtl_json_writer_putc(self,'\"');
              dtl_json_writer_print(self,pcVar11);
              dtl_json_writer_print(self,"\": ");
              pdVar9 = dtl_hv_get_cstr((dtl_hv_t *)dv,pcVar11);
              dtl_json_writer_write_dv(self,pdVar9,true);
            }
          }
        }
        else {
          dtl_json_writer_print(self,self->newLineStr);
          local_7c = iVar6 + -1;
          for (iVar12 = 0; iVar6 != iVar12; iVar12 = iVar12 + 1) {
            buf[0] = '\0';
            pdVar10 = (dtl_sv_t *)dtl_av_value(pdVar8,iVar12);
            pcVar11 = dtl_sv_to_cstr(pdVar10,(_Bool *)buf);
            if (buf[0] == '\x01') {
              dtl_json_writer_write_indent_str(self);
              dtl_json_writer_putc(self,'\"');
              dtl_json_writer_print(self,pcVar11);
              dtl_json_writer_print(self,"\": ");
              pdVar9 = dtl_hv_get_cstr((dtl_hv_t *)dv,pcVar11);
              dtl_json_writer_write_dv(self,pdVar9,false);
              if (iVar12 < local_7c) {
                dtl_json_writer_print(self,",");
              }
              dtl_json_writer_print(self,self->newLineStr);
            }
          }
        }
        dtl_json_writer_decreaseIndent(self);
      }
      dtl_json_writer_indented_cstr(self,"}");
      dtl_dv_dec_ref((dtl_dv_t *)pdVar8);
      cstr = extraout_RAX;
    }
    goto switchD_0013a1b7_caseD_2;
  }
  if (dVar4 == DTL_DV_ARRAY) {
    iVar6 = dtl_av_length((dtl_av_t *)dv);
    if (indentEnable) {
      dtl_json_writer_indented_cstr(self,"[");
    }
    else {
      dtl_json_writer_putc(self,'[');
    }
    if (0 < iVar6) {
      dtl_json_writer_increaseIndent(self);
      if (self->currentIndent == 0) {
        for (iVar12 = 0; iVar6 != iVar12; iVar12 = iVar12 + 1) {
          pdVar9 = dtl_av_value((dtl_av_t *)dv,iVar12);
          if (iVar12 != 0) {
            dtl_json_writer_print(self,", ");
          }
          if (pdVar9 == (dtl_dv_t *)0x0) {
            dtl_json_writer_print(self,"NULL");
          }
          else {
            dtl_json_writer_write_dv(self,pdVar9,true);
          }
        }
      }
      else {
        dtl_json_writer_print(self,self->newLineStr);
        for (iVar12 = 0; iVar6 != iVar12; iVar12 = iVar12 + 1) {
          pdVar9 = dtl_av_value((dtl_av_t *)dv,iVar12);
          if (pdVar9 != (dtl_dv_t *)0x0) {
            dtl_json_writer_write_dv(self,pdVar9,true);
          }
          if (iVar12 < iVar6 + -1) {
            dtl_json_writer_print(self,",");
          }
          dtl_json_writer_print(self,self->newLineStr);
        }
      }
      dtl_json_writer_decreaseIndent(self);
    }
    dtl_json_writer_indented_cstr(self,"]");
    return extraout_EAX;
  }
  cstr = (dtl_av_t *)(ulong)dVar4;
  if (dVar4 != DTL_DV_SCALAR) goto switchD_0013a1b7_caseD_2;
  local_7d = false;
  if (indentEnable) {
    dtl_json_writer_write_indent_str(self);
  }
  dVar5 = dtl_sv_type((dtl_sv_t *)dv);
  pdVar8 = (dtl_av_t *)(ulong)(dVar5 - DTL_SV_I32);
  cstr = pdVar8;
  if (8 < dVar5 - DTL_SV_I32) goto switchD_0013a1b7_caseD_2;
  cstr = (dtl_av_t *)
         ((long)&switchD_0013a1b7::switchdataD_00145ea8 +
         (long)(int)(&switchD_0013a1b7::switchdataD_00145ea8)[(long)pdVar8]);
  switch(pdVar8) {
  case (dtl_av_t *)0x0:
    uVar7 = dtl_sv_to_i32((dtl_sv_t *)dv,(_Bool *)0x0);
    __stream = (FILE *)self->destFile;
    pcVar1 = "%d,%d";
    break;
  case (dtl_av_t *)0x1:
    uVar7 = dtl_sv_to_u32((dtl_sv_t *)dv,(_Bool *)0x0);
    __stream = (FILE *)self->destFile;
    pcVar1 = "%u,%u";
    break;
  default:
    goto switchD_0013a1b7_caseD_2;
  case (dtl_av_t *)0x7:
    _Var2 = dtl_sv_to_bool((dtl_sv_t *)dv,(_Bool *)0x0);
    pcVar11 = "false";
    if (_Var2) {
      pcVar11 = "true";
    }
    if ((FILE *)self->destFile != (FILE *)0x0) {
      uVar7 = fputs(pcVar11,(FILE *)self->destFile);
      cstr = (dtl_av_t *)(ulong)uVar7;
      goto switchD_0013a1b7_caseD_2;
    }
    self_00 = self->destStr;
    goto LAB_0013a589;
  case (dtl_av_t *)0x8:
    cstr = (dtl_av_t *)dtl_sv_to_cstr((dtl_sv_t *)dv,&local_7d);
    if (local_7d == true) {
      if (cstr == (dtl_av_t *)0x0) {
        __assert_fail("val.str != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_json/src/dtl_json_writer.c"
                      ,0x149,
                      "dtl_error_t dtl_json_writer_write_sv(dtl_json_writer_t *, const dtl_sv_t *, _Bool)"
                     );
      }
      if ((FILE *)self->destFile == (FILE *)0x0) {
        adt_str_push(self->destStr,0x22);
        adt_str_append_cstr(self->destStr,(char *)cstr);
        aVar3 = adt_str_push(self->destStr,0x22);
        cstr = (dtl_av_t *)CONCAT71(extraout_var_00,aVar3);
      }
      else {
        uVar7 = fprintf((FILE *)self->destFile,"\"%s\"",cstr);
        cstr = (dtl_av_t *)(ulong)uVar7;
      }
    }
    goto switchD_0013a1b7_caseD_2;
  }
  if (__stream == (FILE *)0x0) {
    pcVar11 = buf;
    sprintf(pcVar11,pcVar1 + 3,(ulong)uVar7);
    self_00 = self->destStr;
LAB_0013a589:
    aVar3 = adt_str_append_cstr(self_00,pcVar11);
    cstr = (dtl_av_t *)CONCAT71(extraout_var,aVar3);
  }
  else {
    uVar7 = fprintf(__stream,pcVar1 + 3,(ulong)uVar7);
    cstr = (dtl_av_t *)(ulong)uVar7;
  }
switchD_0013a1b7_caseD_2:
  return (dtl_error_t)cstr;
}

Assistant:

static dtl_error_t dtl_json_writer_write_dv(dtl_json_writer_t *self, const dtl_dv_t *dv, bool indentEnable)
{
   if ( (self != 0) && (dv != 0) )
   {
      switch (dtl_dv_type(dv))
      {
      case DTL_DV_INVALID:
         break;
      case DTL_DV_NULL:
         break;
      case DTL_DV_SCALAR:
         dtl_json_writer_write_sv(self, (const dtl_sv_t*) dv, indentEnable);
         break;
      case DTL_DV_ARRAY:
         dtl_json_writer_write_av(self, (const dtl_av_t*) dv, indentEnable);
         break;
      case DTL_DV_HASH:
         dtl_json_writer_write_hv(self, (const dtl_hv_t*) dv, indentEnable);
         break;
      default:
         break;
      }
      return DTL_NO_ERROR;
   }
   return DTL_INVALID_ARGUMENT_ERROR;
}